

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall ADynamicLight::Serialize(ADynamicLight *this,FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  FArchive *arc_local;
  ADynamicLight *this_local;
  
  AActor::Serialize(&this->super_AActor,arc);
  pFVar2 = FArchive::operator<<(arc,&this->lightflags);
  FArchive::operator<<(pFVar2,&this->lighttype);
  pFVar2 = FArchive::operator<<(arc,&this->m_tickCount);
  FArchive::operator<<(pFVar2,&this->m_currentRadius);
  pFVar2 = FArchive::operator<<(arc,this->m_Radius);
  FArchive::operator<<(pFVar2,this->m_Radius + 1);
  if (this->lighttype == '\x01') {
    pFVar2 = FArchive::operator<<(arc,&this->m_lastUpdate);
    ::operator<<(pFVar2,&this->m_cycler);
  }
  bVar1 = FArchive::IsLoading(arc);
  if (bVar1) {
    this->visibletoplayer = true;
    LinkLight(this);
  }
  return;
}

Assistant:

void ADynamicLight::Serialize(FArchive &arc)
{
	Super::Serialize (arc);
	arc << lightflags << lighttype;
	arc << m_tickCount << m_currentRadius;
	arc << m_Radius[0] << m_Radius[1];

	if (lighttype == PulseLight) arc << m_lastUpdate << m_cycler;
	if (arc.IsLoading())
	{
		// The default constructor which is used for creating objects before deserialization will not set this variable.
		// It needs to be true for all placed lights.
		visibletoplayer = true;
		LinkLight();
	}
}